

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_static_test.cpp
# Opt level: O2

void dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<8,1>>>>
               (MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
                *x,char *name)

{
  ostream *poVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,name);
  poVar1 = std::operator<<(poVar1," has ndims:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,3);
  poVar1 = std::operator<<(poVar1," numel:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xf0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout," sizes: ");
  iVar4 = 3;
  while( true ) {
    if (iVar4 == 0) break;
    iVar2 = (uint)(iVar4 + -1 == 0) << 3;
    if (iVar4 == 2) {
      iVar2 = 6;
    }
    if (iVar4 == 3) {
      iVar2 = 5;
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::operator<<(poVar1," ");
    iVar4 = iVar4 + -1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout," steps: ");
  iVar4 = 3;
  while( true ) {
    if (iVar4 == 0) break;
    uVar3 = (uint)(iVar4 + -1 == 0);
    if (iVar4 == 2) {
      uVar3 = 0x38;
    }
    if (iVar4 == 3) {
      uVar3 = 0x150;
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
    std::operator<<(poVar1," ");
    iVar4 = iVar4 + -1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void dumpinfo(const T& x,const char * name)
{
	std::cout << name << " has ndims:" << x.ndims() << " numel:" << x.numel() << std::endl;
	std::cout << " sizes: ";
	for(int i = 0; i < x.ndims(); i++)
	{
		std::cout << x.getsize(i) << " ";
	}
	std::cout << std::endl;
	std::cout << " steps: ";
	for(int i = 0; i < x.ndims(); i++)
	{
		std::cout << x.getstep(i) << " ";
	}
	std::cout << std::endl;
}